

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall
CConnman::AddConnection
          (CConnman *this,string *address,ConnectionType conn_type,bool use_v2transport)

{
  bool bVar1;
  pointer ppCVar2;
  byte bVar3;
  int unaff_R13D;
  int iVar4;
  long in_FS_OFFSET;
  CSemaphoreGrant local_80;
  direct_or_indirect local_70;
  uint local_60;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = false;
  bVar3 = 0;
  switch(conn_type) {
  case INBOUND:
  case MANUAL:
switchD_008bbe7e_caseD_0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return bVar1;
    }
    __stack_chk_fail();
  case OUTBOUND_FULL_RELAY:
    unaff_R13D = this->m_max_outbound_full_relay;
    break;
  default:
    goto switchD_008bbe7e_caseD_3;
  case BLOCK_RELAY:
    unaff_R13D = this->m_max_outbound_block_relay;
  }
  bVar3 = 1;
switchD_008bbe7e_caseD_3:
  local_70.indirect_contents.indirect = (char *)&this->m_nodes_mutex;
  local_70.direct[8] = '\0';
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&local_70.indirect_contents);
  iVar4 = 0;
  for (ppCVar2 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppCVar2 !=
      (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppCVar2 = ppCVar2 + 1) {
    iVar4 = iVar4 + (uint)((*ppCVar2)->m_conn_type == conn_type);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_70.indirect_contents);
  if ((bool)(bVar3 & unaff_R13D <= iVar4)) {
    bVar1 = false;
  }
  else {
    local_80.sem = (this->semOutbound)._M_t.
                   super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
                   super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
                   super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
    bVar1 = CSemaphore::try_wait(local_80.sem);
    if (bVar1) {
      local_80.fHaveGrant = true;
      CService::CService((CService *)&local_70.indirect_contents);
      local_48 = 100000000;
      local_40 = 0;
      OpenNetworkConnection
                (this,(CAddress *)&local_70.indirect_contents,false,&local_80,
                 (address->_M_dataplus)._M_p,conn_type,use_v2transport);
      if (0x10 < local_60) {
        free(local_70.indirect_contents.indirect);
      }
      if ((local_80.fHaveGrant & 1U) != 0) {
        CSemaphore::post(local_80.sem);
      }
    }
  }
  goto switchD_008bbe7e_caseD_0;
}

Assistant:

bool CConnman::AddConnection(const std::string& address, ConnectionType conn_type, bool use_v2transport = false)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    std::optional<int> max_connections;
    switch (conn_type) {
    case ConnectionType::INBOUND:
    case ConnectionType::MANUAL:
        return false;
    case ConnectionType::OUTBOUND_FULL_RELAY:
        max_connections = m_max_outbound_full_relay;
        break;
    case ConnectionType::BLOCK_RELAY:
        max_connections = m_max_outbound_block_relay;
        break;
    // no limit for ADDR_FETCH because -seednode has no limit either
    case ConnectionType::ADDR_FETCH:
        break;
    // no limit for FEELER connections since they're short-lived
    case ConnectionType::FEELER:
        break;
    } // no default case, so the compiler can warn about missing cases

    // Count existing connections
    int existing_connections = WITH_LOCK(m_nodes_mutex,
                                         return std::count_if(m_nodes.begin(), m_nodes.end(), [conn_type](CNode* node) { return node->m_conn_type == conn_type; }););

    // Max connections of specified type already exist
    if (max_connections != std::nullopt && existing_connections >= max_connections) return false;

    // Max total outbound connections already exist
    CSemaphoreGrant grant(*semOutbound, true);
    if (!grant) return false;

    OpenNetworkConnection(CAddress(), false, std::move(grant), address.c_str(), conn_type, /*use_v2transport=*/use_v2transport);
    return true;
}